

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relocate.cpp
# Opt level: O3

void Relocation::refreshMaxTableCount(void)

{
  ulong uVar1;
  
  uVar1 = DAT_0018e338 - offsets >> 1;
  if (maxTableCount < uVar1) {
    maxTableCount = uVar1;
  }
  if ((type == 0) && (maxTableCount == 0)) {
    return;
  }
  isResultAffected = 0;
  deltaType = 0;
  CLabelTable::Insert(&LabelTable,"relocate_count",(aint)maxTableCount,2,-1);
  CLabelTable::Insert(&LabelTable,"relocate_size",(int)maxTableCount * 2,2,-1);
  return;
}

Assistant:

static void Relocation::refreshMaxTableCount() {
	if (maxTableCount < offsets.size()) {
		maxTableCount = offsets.size();
	}
	// add the relocate_count and relocate_size symbols only when RELOCATE feature was used
	if (type || maxTableCount) {
		isResultAffected = false;
		deltaType = OFF;
		LabelTable.Insert("relocate_count", maxTableCount, LABEL_IS_DEFL);
		LabelTable.Insert("relocate_size", maxTableCount * 2, LABEL_IS_DEFL);
	}
}